

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-opt64.c
# Opt level: O2

void KeccakP1600_ExtractAndAddBytes(void *state,uchar *input,uchar *output,uint offset,uint length)

{
  uint _sizeLeft;
  uint uVar1;
  ulong uVar2;
  uint lanePosition;
  uint offset_00;
  ulong uVar3;
  
  uVar2 = (ulong)length;
  if (offset != 0) {
    lanePosition = offset >> 3;
    offset_00 = offset & 7;
    while (uVar1 = (uint)uVar2, uVar1 != 0) {
      uVar3 = (ulong)(8 - offset_00);
      if (uVar1 <= 8 - offset_00) {
        uVar3 = uVar2;
      }
      KeccakP1600_ExtractAndAddBytesInLane(state,lanePosition,input,output,offset_00,(uint)uVar3);
      lanePosition = lanePosition + 1;
      input = input + uVar3;
      output = output + uVar3;
      offset_00 = 0;
      uVar2 = (ulong)(uVar1 - (uint)uVar3);
    }
    return;
  }
  KeccakP1600_ExtractAndAddLanes(state,input,output,length >> 3);
  KeccakP1600_ExtractAndAddBytesInLane
            (state,length >> 3,input + (length & 0xfffffff8),output + (length & 0xfffffff8),0,
             length & 7);
  return;
}

Assistant:

void KeccakP1600_ExtractAndAddBytes(const void *state, const unsigned char *input, unsigned char *output, unsigned int offset, unsigned int length)
{
    SnP_ExtractAndAddBytes(state, input, output, offset, length, KeccakP1600_ExtractAndAddLanes, KeccakP1600_ExtractAndAddBytesInLane, 8);
}